

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_PlayerInfo.h
# Opt level: O0

string_view __thiscall RenX::PlayerInfo::get_rdns(PlayerInfo *this)

{
  bool bVar1;
  long lVar2;
  element_type *this_00;
  __sv_type _Var3;
  string_view sVar4;
  PlayerInfo *this_local;
  
  lVar2 = std::
          __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ::use_count(&(this->m_rdns_ptr).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     );
  if ((lVar2 == 1) && (bVar1 = std::operator==(&this->m_rdns_ptr,(nullptr_t)0x0), !bVar1)) {
    this_00 = std::
              __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_rdns_ptr);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    sVar4._M_len = _Var3._M_len;
    sVar4._M_str = _Var3._M_str;
    return sVar4;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  return _this_local;
}

Assistant:

std::string_view get_rdns() const {
			if (m_rdns_ptr.use_count() != 1
				|| m_rdns_ptr == nullptr) {
				return {};
			}

			// In theory if get_rdns() were ever called at the same time as start_resolve_rdns(), on separate threads,
			// then there would be a race condition here causing undefined behavior. However, we only interact with
			// players on a single thread, and even beyond that, we only call start_resolve_rdns() immediately after
			// constructing PlayerInfo. Therefore, this is safe
			return *m_rdns_ptr;
		}